

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O2

FILE * pugi::impl::anon_unknown_0::open_file_wide(wchar_t *path,wchar_t *mode)

{
  size_t i;
  size_t length;
  size_t sVar1;
  char *__filename;
  long lVar2;
  FILE *pFVar3;
  uint8_t *begin;
  char mode_ascii [4];
  char local_2c [4];
  
  length = strlength_wide(path);
  sVar1 = as_utf8_begin(path,length);
  __filename = (char *)(*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>
                                 ::allocate)(sVar1 + 1);
  if (__filename == (char *)0x0) {
    pFVar3 = (FILE *)0x0;
  }
  else {
    utf32_decoder<pugi::impl::(anonymous_namespace)::opt_false>::
    process<pugi::impl::(anonymous_namespace)::utf8_writer>(path,length,__filename);
    __filename[sVar1] = '\0';
    local_2c[0] = '\0';
    local_2c[1] = '\0';
    local_2c[2] = '\0';
    local_2c[3] = '\0';
    for (lVar2 = 0; mode[lVar2] != L'\0'; lVar2 = lVar2 + 1) {
      local_2c[lVar2] = (char)mode[lVar2];
    }
    pFVar3 = fopen(__filename,local_2c);
    (*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::deallocate)
              (__filename);
  }
  return (FILE *)pFVar3;
}

Assistant:

PUGI__FN FILE* open_file_wide(const wchar_t* path, const wchar_t* mode)
	{
		// there is no standard function to open wide paths, so our best bet is to try utf8 path
		char* path_utf8 = convert_path_heap(path);
		if (!path_utf8) return 0;

		// convert mode to ASCII (we mirror _wfopen interface)
		char mode_ascii[4] = {0};
		for (size_t i = 0; mode[i]; ++i) mode_ascii[i] = static_cast<char>(mode[i]);

		// try to open the utf8 path
		FILE* result = fopen(path_utf8, mode_ascii);

		// free dummy buffer
		xml_memory::deallocate(path_utf8);

		return result;
	}